

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::flags_to_qualifiers_glsl_abi_cxx11_
          (CompilerGLSL *this,SPIRType *type,Bitset *flags)

{
  bool bVar1;
  bool bVar2;
  SPIREntryPoint *pSVar3;
  Bitset *in_RCX;
  char *pcVar4;
  bool bVar5;
  bool implied_ihighp;
  bool implied_fhighp;
  bool implied_imediump;
  bool implied_fmediump;
  SPIREntryPoint *execution;
  bool type_supports_precision;
  allocator local_29;
  Bitset *local_28;
  Bitset *flags_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  string *qual;
  
  local_28 = in_RCX;
  flags_local = flags;
  type_local = type;
  this_local = this;
  bVar2 = Bitset::get(in_RCX,0x14eb);
  if (bVar2) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"restrict ",&local_29);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    ::std::__cxx11::string::string((string *)this);
    bVar2 = type_is_floating_point((SPIRType *)flags_local);
    if (((bVar2) && (bVar2 = Bitset::get(local_28,0x2a), bVar2)) &&
       (((ulong)type[0x19].super_IVariant._vptr_IVariant & 0x100000000000000) != 0)) {
      ::std::__cxx11::string::operator=((string *)this,"precise ");
    }
    bVar2 = true;
    if (((*(int *)((long)&(flags_local->higher)._M_h._M_buckets + 4) != 0xd) &&
        (bVar2 = true, *(int *)((long)&(flags_local->higher)._M_h._M_buckets + 4) != 7)) &&
       ((bVar2 = true, *(int *)((long)&(flags_local->higher)._M_h._M_buckets + 4) != 8 &&
        ((bVar2 = true, *(int *)((long)&(flags_local->higher)._M_h._M_buckets + 4) != 0x10 &&
         (bVar2 = true, *(int *)((long)&(flags_local->higher)._M_h._M_buckets + 4) != 0x11)))))) {
      bVar2 = *(int *)((long)&(flags_local->higher)._M_h._M_buckets + 4) == 0x12;
    }
    if (bVar2) {
      if ((type[0x16].image.type.id & 1) == 0) {
        if (((type[0x18].member_name_cache._M_h._M_rehash_policy._M_next_resize & 0x1000000000000)
             != 0) && (bVar2 = Bitset::get(local_28,0), bVar2)) {
          ::std::__cxx11::string::operator+=((string *)this,"mediump ");
        }
      }
      else {
        pSVar3 = Compiler::get_entry_point((Compiler *)type);
        bVar2 = Bitset::get(local_28,0);
        if (bVar2) {
          bVar2 = false;
          if ((*(int *)((long)&(flags_local->higher)._M_h._M_buckets + 4) == 0xd) &&
             (bVar2 = false, type[0x16].parent_type.id == 2)) {
            bVar2 = pSVar3->model == ExecutionModelFragment;
          }
          if (((*(int *)((long)&(flags_local->higher)._M_h._M_buckets + 4) == 7) ||
              (bVar5 = false, *(int *)((long)&(flags_local->higher)._M_h._M_buckets + 4) == 8)) &&
             (bVar5 = false, *(int *)&type[0x16].member_name_cache._M_h._M_buckets == 2)) {
            bVar5 = pSVar3->model == ExecutionModelFragment;
          }
          bVar1 = true;
          if (!bVar2) {
            bVar1 = bVar5;
          }
          pcVar4 = "mediump ";
          if (bVar1) {
            pcVar4 = "";
          }
          ::std::__cxx11::string::operator+=((string *)this,pcVar4);
        }
        else {
          bVar2 = false;
          if ((*(int *)((long)&(flags_local->higher)._M_h._M_buckets + 4) == 0xd) &&
             ((type[0x16].parent_type.id != 3 ||
              (bVar2 = true, pSVar3->model != ExecutionModelFragment)))) {
            bVar2 = pSVar3->model != ExecutionModelFragment;
          }
          if (((*(int *)((long)&(flags_local->higher)._M_h._M_buckets + 4) == 7) ||
              (bVar5 = false, *(int *)((long)&(flags_local->higher)._M_h._M_buckets + 4) == 8)) &&
             ((*(int *)&type[0x16].member_name_cache._M_h._M_buckets != 3 ||
              (bVar5 = true, pSVar3->model != ExecutionModelFragment)))) {
            bVar5 = pSVar3->model != ExecutionModelFragment;
          }
          bVar1 = true;
          if (!bVar2) {
            bVar1 = bVar5;
          }
          pcVar4 = "highp ";
          if (bVar1) {
            pcVar4 = "";
          }
          ::std::__cxx11::string::operator+=((string *)this,pcVar4);
        }
      }
    }
  }
  return this;
}

Assistant:

string CompilerGLSL::flags_to_qualifiers_glsl(const SPIRType &type, const Bitset &flags)
{
	// GL_EXT_buffer_reference variables can be marked as restrict.
	if (flags.get(DecorationRestrictPointerEXT))
		return "restrict ";

	string qual;

	if (type_is_floating_point(type) && flags.get(DecorationNoContraction) && backend.support_precise_qualifier)
		qual = "precise ";

	// Structs do not have precision qualifiers, neither do doubles (desktop only anyways, so no mediump/highp).
	bool type_supports_precision =
			type.basetype == SPIRType::Float || type.basetype == SPIRType::Int || type.basetype == SPIRType::UInt ||
			type.basetype == SPIRType::Image || type.basetype == SPIRType::SampledImage ||
			type.basetype == SPIRType::Sampler;

	if (!type_supports_precision)
		return qual;

	if (options.es)
	{
		auto &execution = get_entry_point();

		if (flags.get(DecorationRelaxedPrecision))
		{
			bool implied_fmediump = type.basetype == SPIRType::Float &&
			                        options.fragment.default_float_precision == Options::Mediump &&
			                        execution.model == ExecutionModelFragment;

			bool implied_imediump = (type.basetype == SPIRType::Int || type.basetype == SPIRType::UInt) &&
			                        options.fragment.default_int_precision == Options::Mediump &&
			                        execution.model == ExecutionModelFragment;

			qual += (implied_fmediump || implied_imediump) ? "" : "mediump ";
		}
		else
		{
			bool implied_fhighp =
			    type.basetype == SPIRType::Float && ((options.fragment.default_float_precision == Options::Highp &&
			                                          execution.model == ExecutionModelFragment) ||
			                                         (execution.model != ExecutionModelFragment));

			bool implied_ihighp = (type.basetype == SPIRType::Int || type.basetype == SPIRType::UInt) &&
			                      ((options.fragment.default_int_precision == Options::Highp &&
			                        execution.model == ExecutionModelFragment) ||
			                       (execution.model != ExecutionModelFragment));

			qual += (implied_fhighp || implied_ihighp) ? "" : "highp ";
		}
	}
	else if (backend.allow_precision_qualifiers)
	{
		// Vulkan GLSL supports precision qualifiers, even in desktop profiles, which is convenient.
		// The default is highp however, so only emit mediump in the rare case that a shader has these.
		if (flags.get(DecorationRelaxedPrecision))
			qual += "mediump ";
	}

	return qual;
}